

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internals.h
# Opt level: O2

uint32_t arm_debug_exception_fsr(CPUARMState_conflict *env)

{
  _Bool _Var1;
  uint el;
  uint32_t uVar2;
  
  el = arm_debug_target_el(env);
  if (((el == 2) || (_Var1 = arm_el_is_aa64(env,el), _Var1)) ||
     ((uVar2 = 2, (env->features & 0x4000000) != 0 &&
      (((env->cp15).tcr_el[el].raw_tcr & 0x80000000) != 0)))) {
    uVar2 = 0x222;
  }
  return uVar2;
}

Assistant:

static inline uint32_t arm_debug_exception_fsr(CPUARMState *env)
{
    ARMMMUFaultInfo fi = { .type = ARMFault_Debug };
    int target_el = arm_debug_target_el(env);
    bool using_lpae = false;

    if (target_el == 2 || arm_el_is_aa64(env, target_el)) {
        using_lpae = true;
    } else {
        if (arm_feature(env, ARM_FEATURE_LPAE) &&
            (env->cp15.tcr_el[target_el].raw_tcr & TTBCR_EAE)) {
            using_lpae = true;
        }
    }

    if (using_lpae) {
        return arm_fi_to_lfsc(&fi);
    } else {
        return arm_fi_to_sfsc(&fi);
    }
}